

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connection_impl.hpp
# Opt level: O2

void __thiscall
websocketpp::connection<websocketpp::config::asio_client>::pong
          (connection<websocketpp::config::asio_client> *this,string *payload,error_code *ec)

{
  mutex_type *pmVar1;
  basic<websocketpp::concurrency::basic,_websocketpp::log::alevel> *pbVar2;
  element_type *peVar3;
  _Elt_pointer psVar4;
  _Elt_pointer psVar5;
  int iVar6;
  ostream *this_00;
  error_category *peVar7;
  size_t in_RCX;
  error_category *extraout_RDX;
  message_ptr msg;
  stringstream ss;
  __shared_ptr<websocketpp::message_buffer::message<websocketpp::message_buffer::alloc::con_msg_manager>,_(__gnu_cxx::_Lock_policy)2>
  local_228 [2];
  __shared_ptr<websocketpp::message_buffer::message<websocketpp::message_buffer::alloc::con_msg_manager>,_(__gnu_cxx::_Lock_policy)2>
  local_208;
  __shared_ptr<websocketpp::message_buffer::message<websocketpp::message_buffer::alloc::con_msg_manager>,_(__gnu_cxx::_Lock_policy)2>
  local_1f8;
  undefined1 local_1e8 [24];
  dispatch_handler local_1d0;
  undefined1 local_1b0 [16];
  element_type *local_1a0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_198 [46];
  
  pbVar2 = (this->m_alog).
           super___shared_ptr<websocketpp::log::basic<websocketpp::concurrency::basic,_websocketpp::log::alevel>,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  if ((pbVar2->m_static_channels & 0x400) != 0) {
    log::basic<websocketpp::concurrency::basic,_websocketpp::log::alevel>::write
              (pbVar2,0x400,"connection pong",in_RCX);
  }
  pmVar1 = &this->m_connection_state_lock;
  std::mutex::lock(pmVar1);
  if (this->m_state != open) {
    std::__cxx11::stringstream::stringstream((stringstream *)local_1b0);
    this_00 = std::operator<<((ostream *)&local_1a0,"connection::pong called from invalid state ");
    std::ostream::operator<<(this_00,this->m_state);
    pbVar2 = (this->m_alog).
             super___shared_ptr<websocketpp::log::basic<websocketpp::concurrency::basic,_websocketpp::log::alevel>,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr;
    std::__cxx11::stringbuf::str();
    log::basic<websocketpp::concurrency::basic,_websocketpp::log::alevel>::write
              (pbVar2,0x400,local_228,in_RCX);
    std::__cxx11::string::~string((string *)local_228);
    peVar7 = error::get_category();
    ec->_M_value = 9;
    ec->_M_cat = peVar7;
    std::__cxx11::stringstream::~stringstream((stringstream *)local_1b0);
    pthread_mutex_unlock((pthread_mutex_t *)pmVar1);
    return;
  }
  pthread_mutex_unlock((pthread_mutex_t *)pmVar1);
  message_buffer::alloc::
  con_msg_manager<websocketpp::message_buffer::message<websocketpp::message_buffer::alloc::con_msg_manager>_>
  ::get_message((con_msg_manager<websocketpp::message_buffer::message<websocketpp::message_buffer::alloc::con_msg_manager>_>
                 *)local_228);
  if (local_228[0]._M_ptr == (element_type *)0x0) {
    peVar7 = error::get_category();
    ec->_M_value = 7;
  }
  else {
    peVar3 = (this->m_processor).
             super___shared_ptr<websocketpp::processor::processor<websocketpp::config::asio_client>,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr;
    std::
    __shared_ptr<websocketpp::message_buffer::message<websocketpp::message_buffer::alloc::con_msg_manager>,_(__gnu_cxx::_Lock_policy)2>
    ::__shared_ptr(&local_1f8,local_228);
    iVar6 = (*peVar3->_vptr_processor[0x15])(peVar3,payload,&local_1f8);
    ec->_M_value = iVar6;
    ec->_M_cat = extraout_RDX;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_1f8._M_refcount);
    if (ec->_M_value != 0) goto LAB_001383a5;
    pmVar1 = &this->m_write_lock;
    std::mutex::lock(pmVar1);
    std::
    __shared_ptr<websocketpp::message_buffer::message<websocketpp::message_buffer::alloc::con_msg_manager>,_(__gnu_cxx::_Lock_policy)2>
    ::__shared_ptr(&local_208,local_228);
    write_push(this,(message_ptr *)&local_208);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_208._M_refcount);
    if (this->m_write_flag == false) {
      psVar4 = (this->m_send_queue).c.
               super__Deque_base<std::shared_ptr<websocketpp::message_buffer::message<websocketpp::message_buffer::alloc::con_msg_manager>_>,_std::allocator<std::shared_ptr<websocketpp::message_buffer::message<websocketpp::message_buffer::alloc::con_msg_manager>_>_>_>
               ._M_impl.super__Deque_impl_data._M_finish._M_cur;
      psVar5 = (this->m_send_queue).c.
               super__Deque_base<std::shared_ptr<websocketpp::message_buffer::message<websocketpp::message_buffer::alloc::con_msg_manager>_>,_std::allocator<std::shared_ptr<websocketpp::message_buffer::message<websocketpp::message_buffer::alloc::con_msg_manager>_>_>_>
               ._M_impl.super__Deque_impl_data._M_start._M_cur;
      pthread_mutex_unlock((pthread_mutex_t *)pmVar1);
      if (psVar4 != psVar5) {
        get_shared((connection<websocketpp::config::asio_client> *)local_1e8);
        local_1b0._0_8_ = write_frame;
        local_1b0._8_8_ = 0;
        local_1a0 = (element_type *)local_1e8._0_8_;
        a_Stack_198[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1e8._8_8_;
        local_1e8._0_8_ = (element_type *)0x0;
        local_1e8._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        std::function<void()>::
        function<std::_Bind<void(websocketpp::connection<websocketpp::config::asio_client>::*(std::shared_ptr<websocketpp::connection<websocketpp::config::asio_client>>))()>,void>
                  ((function<void()> *)(local_1e8 + 0x18),
                   (_Bind<void_(websocketpp::connection<websocketpp::config::asio_client>::*(std::shared_ptr<websocketpp::connection<websocketpp::config::asio_client>_>))()>
                    *)local_1b0);
        transport::asio::connection<websocketpp::config::asio_client::transport_config>::dispatch
                  (&this->super_transport_con_type,(dispatch_handler *)(local_1e8 + 0x18));
        std::_Function_base::~_Function_base((_Function_base *)(local_1e8 + 0x18));
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(a_Stack_198);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_1e8 + 8));
      }
    }
    else {
      pthread_mutex_unlock((pthread_mutex_t *)pmVar1);
    }
    peVar7 = (error_category *)std::_V2::system_category();
    ec->_M_value = 0;
  }
  ec->_M_cat = peVar7;
LAB_001383a5:
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_228[0]._M_refcount);
  return;
}

Assistant:

void connection<config>::pong(std::string const& payload, lib::error_code& ec) {
    if (m_alog->static_test(log::alevel::devel)) {
        m_alog->write(log::alevel::devel,"connection pong");
    }

    {
        scoped_lock_type lock(m_connection_state_lock);
        if (m_state != session::state::open) {
            std::stringstream ss;
            ss << "connection::pong called from invalid state " << m_state;
            m_alog->write(log::alevel::devel,ss.str());
            ec = error::make_error_code(error::invalid_state);
            return;
        }
    }

    message_ptr msg = m_msg_manager->get_message();
    if (!msg) {
        ec = error::make_error_code(error::no_outgoing_buffers);
        return;
    }

    ec = m_processor->prepare_pong(payload,msg);
    if (ec) {return;}

    bool needs_writing = false;
    {
        scoped_lock_type lock(m_write_lock);
        write_push(msg);
        needs_writing = !m_write_flag && !m_send_queue.empty();
    }

    if (needs_writing) {
        transport_con_type::dispatch(lib::bind(
            &type::write_frame,
            type::get_shared()
        ));
    }

    ec = lib::error_code();
}